

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pragmaVtabFilter(sqlite3_vtab_cursor *pVtabCursor,int idxNum,char *idxStr,int argc,
                    sqlite3_value **argv)

{
  sqlite3_vtab *psVar1;
  uchar *puVar2;
  sqlite3_vtab *psVar3;
  char *pcVar4;
  char *zText;
  char *zSql;
  StrAccum acc;
  int local_50;
  int j;
  int i;
  int rc;
  PragmaVtab *pTab;
  PragmaVtabCursor *pCsr;
  sqlite3_value **argv_local;
  int argc_local;
  char *idxStr_local;
  int idxNum_local;
  sqlite3_vtab_cursor *pVtabCursor_local;
  
  psVar1 = pVtabCursor->pVtab;
  pragmaVtabCursorClear((PragmaVtabCursor *)pVtabCursor);
  acc._28_4_ = ZEXT14((*(byte *)(*(long *)&psVar1[1].nRef + 9) & 0x20) == 0);
  local_50 = 0;
  do {
    if (argc <= local_50) {
      sqlite3StrAccumInit((StrAccum *)&zSql,(sqlite3 *)0x0,(char *)0x0,0,
                          *(int *)&(psVar1[1].pModule)->xCommit);
      sqlite3_str_appendall((sqlite3_str *)&zSql,"PRAGMA ");
      if (pVtabCursor[4].pVtab != (sqlite3_vtab *)0x0) {
        sqlite3_str_appendf((StrAccum *)&zSql,"%Q.",pVtabCursor[4].pVtab);
      }
      sqlite3_str_appendall((sqlite3_str *)&zSql,(char *)**(undefined8 **)&psVar1[1].nRef);
      if (pVtabCursor[3].pVtab != (sqlite3_vtab *)0x0) {
        sqlite3_str_appendf((StrAccum *)&zSql,"=%Q",pVtabCursor[3].pVtab);
      }
      pcVar4 = sqlite3StrAccumFinish((StrAccum *)&zSql);
      if (pcVar4 == (char *)0x0) {
        pVtabCursor_local._4_4_ = 7;
      }
      else {
        pVtabCursor_local._4_4_ =
             sqlite3_prepare_v2((sqlite3 *)psVar1[1].pModule,pcVar4,-1,
                                (sqlite3_stmt **)(pVtabCursor + 1),(char **)0x0);
        sqlite3_free(pcVar4);
        if (pVtabCursor_local._4_4_ == 0) {
          pVtabCursor_local._4_4_ = pragmaVtabNext(pVtabCursor);
        }
        else {
          pcVar4 = sqlite3_errmsg((sqlite3 *)psVar1[1].pModule);
          pcVar4 = sqlite3_mprintf("%s",pcVar4);
          psVar1->zErrMsg = pcVar4;
        }
      }
      return pVtabCursor_local._4_4_;
    }
    puVar2 = sqlite3_value_text(argv[local_50]);
    if (puVar2 != (uchar *)0x0) {
      psVar3 = (sqlite3_vtab *)sqlite3_mprintf("%s",puVar2);
      pVtabCursor[(long)(int)acc._28_4_ + 3].pVtab = psVar3;
      if (pVtabCursor[(long)(int)acc._28_4_ + 3].pVtab == (sqlite3_vtab *)0x0) {
        return 7;
      }
    }
    local_50 = local_50 + 1;
    acc._28_4_ = acc._28_4_ + 1;
  } while( true );
}

Assistant:

static int pragmaVtabFilter(
  sqlite3_vtab_cursor *pVtabCursor, 
  int idxNum, const char *idxStr,
  int argc, sqlite3_value **argv
){
  PragmaVtabCursor *pCsr = (PragmaVtabCursor*)pVtabCursor;
  PragmaVtab *pTab = (PragmaVtab*)(pVtabCursor->pVtab);
  int rc;
  int i, j;
  StrAccum acc;
  char *zSql;

  UNUSED_PARAMETER(idxNum);
  UNUSED_PARAMETER(idxStr);
  pragmaVtabCursorClear(pCsr);
  j = (pTab->pName->mPragFlg & PragFlg_Result1)!=0 ? 0 : 1;
  for(i=0; i<argc; i++, j++){
    const char *zText = (const char*)sqlite3_value_text(argv[i]);
    assert( j<ArraySize(pCsr->azArg) );
    assert( pCsr->azArg[j]==0 );
    if( zText ){
      pCsr->azArg[j] = sqlite3_mprintf("%s", zText);
      if( pCsr->azArg[j]==0 ){
        return SQLITE_NOMEM;
      }
    }
  }
  sqlite3StrAccumInit(&acc, 0, 0, 0, pTab->db->aLimit[SQLITE_LIMIT_SQL_LENGTH]);
  sqlite3_str_appendall(&acc, "PRAGMA ");
  if( pCsr->azArg[1] ){
    sqlite3_str_appendf(&acc, "%Q.", pCsr->azArg[1]);
  }
  sqlite3_str_appendall(&acc, pTab->pName->zName);
  if( pCsr->azArg[0] ){
    sqlite3_str_appendf(&acc, "=%Q", pCsr->azArg[0]);
  }
  zSql = sqlite3StrAccumFinish(&acc);
  if( zSql==0 ) return SQLITE_NOMEM;
  rc = sqlite3_prepare_v2(pTab->db, zSql, -1, &pCsr->pPragma, 0);
  sqlite3_free(zSql);
  if( rc!=SQLITE_OK ){
    pTab->base.zErrMsg = sqlite3_mprintf("%s", sqlite3_errmsg(pTab->db));
    return rc;
  }
  return pragmaVtabNext(pVtabCursor);
}